

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

void lf::io::WriteToFile(VtkFile *vtk_file,string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  LfException *pLVar3;
  allocator<char> local_1199;
  string local_1198;
  undefined1 local_1178 [8];
  VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
  grammar_1;
  VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>
  grammar;
  undefined1 local_280 [7];
  bool result;
  ostream_iterator<char,_char,_std::char_traits<char>_> outit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostream_type local_218 [8];
  ofstream file;
  string *filename_local;
  VtkFile *vtk_file_local;
  
  _Var2 = std::operator|(_S_out,_S_bin);
  _Var2 = std::operator|(_Var2,_S_trunc);
  std::ofstream::ofstream(local_218,(string *)filename,_Var2);
  anon_unknown_1::ValidateVtkFile(vtk_file);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    outit.delim._7_1_ = 1;
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_268,"Could not open file ",filename);
    std::operator+(&local_248,&local_268," for writing.");
    lf::base::LfException::LfException(pLVar3,&local_248);
    outit.delim._7_1_ = 0;
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)local_280,local_218,
             (char *)0x0);
  if (vtk_file->format == BINARY) {
    anon_unknown_1::
    VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>::
    VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>
                *)((long)&grammar_1.vector_data_double.f.
                          super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                          .super_function_base.functor + 0x10));
    grammar.vector_data_double.f.
    super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
    .super_function_base.functor.data[0x17] =
         boost::spirit::karma::
         generate<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::(anonymous_namespace)::VtkGrammar<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,true>,lf::io::VtkFile>
                   ((ostream_iterator<char,_char,_std::char_traits<char>_> *)local_280,
                    (VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>
                     *)((long)&grammar_1.vector_data_double.f.
                               super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                               .super_function_base.functor + 0x10),vtk_file);
    anon_unknown_1::
    VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>::
    ~VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>
                 *)((long)&grammar_1.vector_data_double.f.
                           super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                           .super_function_base.functor + 0x10));
  }
  else {
    anon_unknown_1::
    VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>::
    VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
                *)local_1178);
    grammar.vector_data_double.f.
    super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
    .super_function_base.functor.data[0x17] =
         boost::spirit::karma::
         generate<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::(anonymous_namespace)::VtkGrammar<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,false>,lf::io::VtkFile>
                   ((ostream_iterator<char,_char,_std::char_traits<char>_> *)local_280,
                    (VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
                     *)local_1178,vtk_file);
    anon_unknown_1::
    VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>::
    ~VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
                 *)local_1178);
  }
  std::ofstream::close();
  if (grammar.vector_data_double.f.
      super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile::VectorData<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
      .super_function_base.functor.data[0x17] == '\0') {
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1198,"Karma error",&local_1199);
    lf::base::LfException::LfException(pLVar3,&local_1198);
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void WriteToFile(const VtkFile& vtk_file, const std::string& filename) {
  std::ofstream file(filename, std::ios_base::out | std::ios_base::binary |
                                   std::ios_base::trunc);
  ValidateVtkFile(vtk_file);

  if (!file.is_open()) {
    throw base::LfException("Could not open file " + filename +
                            " for writing.");
  }
  karma::ostream_iterator<char> outit(file);

  bool result = false;
  if (vtk_file.format == VtkFile::Format::BINARY) {
    const VtkGrammar<decltype(outit), true> grammar{};
    result = karma::generate(outit, grammar, vtk_file);
  } else {
    const VtkGrammar<decltype(outit), false> grammar{};
    result = karma::generate(outit, grammar, vtk_file);
  }

  file.close();
  if (!result) {
    throw base::LfException("Karma error");
  }
}